

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

void dg::vr::RelationsAnalyzer::gepGen(ValueRelations *graph,GetElementPtrInst *gep)

{
  pointer ppVVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  GetElementPtrInst *gep_00;
  VectorSet<const_llvm::Value_*> *pVVar6;
  pointer ppVVar7;
  iterator it;
  GetElementPtrInst *otherGep;
  GetElementPtrInst *local_118;
  iterator local_110;
  iterator local_a0;
  
  local_118 = gep;
  cVar2 = llvm::GetElementPtrInst::hasAllZeroIndices();
  if (cVar2 != '\0') {
    local_110.visited._M_t._M_impl._0_8_ =
         *(undefined8 *)(gep + -(ulong)(uint)(*(int *)(gep + 0x14) << 5));
    ValueRelations::set<llvm::GetElementPtrInst_const*,llvm::Value_const*>
              (graph,&local_118,EQ,(Value **)&local_110);
    gep = local_118;
  }
  iVar4 = toChange(gep);
  gep_00 = ValueRelations::getInstance<llvm::GetElementPtrInst>
                     (graph,*(V *)(local_118 + -(ulong)(uint)(*(int *)(local_118 + 0x14) << 5)));
  if (gep_00 == (GetElementPtrInst *)0x0) {
LAB_0011db58:
    if (iVar4 == 0) goto LAB_0011db8d;
  }
  else {
    iVar5 = toChange(gep_00);
    if (iVar4 != -iVar5 || (iVar5 == 0 || iVar4 == 0)) goto LAB_0011db58;
    local_110.visited._M_t._M_impl._0_8_ =
         *(undefined8 *)(gep_00 + -(ulong)(uint)(*(int *)(gep_00 + 0x14) << 5));
    ValueRelations::set<llvm::GetElementPtrInst_const*,llvm::Value_const*>
              (graph,&local_118,EQ,(Value **)&local_110);
  }
  local_110.visited._M_t._M_impl._0_8_ =
       *(undefined8 *)(local_118 + -(ulong)(uint)(*(int *)(local_118 + 0x14) << 5));
  ValueRelations::set<llvm::Value_const*,llvm::GetElementPtrInst_const*>
            (graph,(Value **)&local_110,(uint)(iVar4 != 1) * 4 + SLT,&local_118);
LAB_0011db8d:
  local_a0.visited._M_t._M_impl._0_8_ = (I)0x400;
  ValueRelations::begin_buckets(&local_110,graph,(Relations *)&local_a0);
  while( true ) {
    ValueRelations::end_buckets(&local_a0,graph);
    bVar3 = true;
    if (local_110.bucketIt._M_node == local_a0.bucketIt._M_node) {
      bVar3 = operator==(&local_110.edgeIt,(EdgeIterator *)((long)&local_a0 + 0x40));
      bVar3 = !bVar3;
    }
    if (local_a0.edgeIt.stack.
        super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.edgeIt.stack.
                      super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a0.edgeIt.stack.
                            super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.edgeIt.stack.
                            super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
    ::_M_erase((_Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
                *)&local_a0,
               (_Link_type)local_a0.visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    if (!bVar3) break;
    pVVar6 = ValueRelations::getEqual
                       (graph,local_110.edgeIt.stack.
                              super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].current._from._M_data);
    ppVVar1 = (pVVar6->vec).
              super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppVVar7 = (pVVar6->vec).
                   super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppVVar7 != ppVVar1;
        ppVVar7 = ppVVar7 + 1) {
      local_a0.visited._M_t._M_impl._0_8_ = *ppVVar7;
      if (*(Value *)(local_a0.visited._M_t._M_impl._0_8_ + 0x10) != (Value)0x3d) {
        local_a0.visited._M_t._M_impl._0_8_ = (I)0x0;
      }
      if ((I)local_a0.visited._M_t._M_impl._0_8_ != (I)0x0) {
        bVar3 = operandsEqual(graph,(I)local_118,(I)local_a0.visited._M_t._M_impl._0_8_,true);
        if (bVar3) {
          ValueRelations::set<llvm::GetElementPtrInst_const*,llvm::GetElementPtrInst_const*>
                    (graph,&local_118,EQ,(GetElementPtrInst **)&local_a0);
          goto LAB_0011dc8b;
        }
      }
    }
    Bucket::EdgeIterator::operator++(&local_110.edgeIt);
    RelationsGraph<dg::vr::ValueRelations>::EdgeIterator::nextViableEdge(&local_110);
  }
LAB_0011dc8b:
  if (local_110.edgeIt.stack.
      super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.edgeIt.stack.
                    super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.edgeIt.stack.
                          super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.edgeIt.stack.
                          super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
  ::_M_erase((_Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
              *)&local_110,
             (_Link_type)local_110.visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  return;
}

Assistant:

void RelationsAnalyzer::gepGen(ValueRelations &graph,
                               const llvm::GetElementPtrInst *gep) {
    if (gep->hasAllZeroIndices())
        graph.setEqual(gep, gep->getPointerOperand());

    int thisChange = toChange(gep);
    if (const auto *origGep = graph.getInstance<llvm::GetElementPtrInst>(
                gep->getPointerOperand())) {
        int origChange = toChange(origGep);
        if (thisChange && origChange && thisChange + origChange == 0)
            graph.set(gep, Relations::EQ, origGep->getPointerOperand());
    }

    if (thisChange)
        graph.set(gep->getPointerOperand(),
                  thisChange == 1 ? Relations::SLT : Relations::SGT, gep);

    for (auto it = graph.begin_buckets(Relations().pt());
         it != graph.end_buckets(); ++it) {
        for (V from : graph.getEqual(it->from())) {
            if (const auto *otherGep =
                        llvm::dyn_cast<llvm::GetElementPtrInst>(from)) {
                if (operandsEqual(graph, gep, otherGep, true)) {
                    graph.setEqual(gep, otherGep);
                    return;
                }
            }
        }
    }
    // TODO something more?
    // indices method gives iterator over indices
}